

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

hash_t __thiscall duckdb::Value::Hash(Value *this)

{
  hash_t hVar1;
  LogicalType local_f0;
  Vector result;
  Vector input;
  
  if (this->is_null == false) {
    Vector::Vector(&input,this);
    LogicalType::LogicalType(&local_f0,UBIGINT);
    Vector::Vector(&result,&local_f0,1);
    LogicalType::~LogicalType(&local_f0);
    VectorOperations::Hash(&input,&result,1);
    hVar1 = *(hash_t *)result.data;
    Vector::~Vector(&result);
    Vector::~Vector(&input);
  }
  else {
    hVar1 = 0;
  }
  return hVar1;
}

Assistant:

hash_t Value::Hash() const {
	if (IsNull()) {
		return 0;
	}
	Vector input(*this);
	Vector result(LogicalType::HASH, 1);
	VectorOperations::Hash(input, result, 1);

	auto data = FlatVector::GetData<hash_t>(result);
	return data[0];
}